

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O3

void __thiscall IntegerCompressor::initCompressor(IntegerCompressor *this)

{
  uint uVar1;
  ArithmeticModel **ppAVar2;
  ArithmeticModel *pAVar3;
  uint uVar4;
  ulong uVar5;
  ArithmeticEncoder *this_00;
  
  this_00 = this->enc;
  if (this_00 != (ArithmeticEncoder *)0x0) {
    if (this->mBits == (ArithmeticModel **)0x0) {
      uVar4 = this->contexts;
      ppAVar2 = (ArithmeticModel **)operator_new__((ulong)uVar4 * 8);
      this->mBits = ppAVar2;
      if ((ulong)uVar4 != 0) {
        uVar5 = 0;
        do {
          pAVar3 = ArithmeticEncoder::createSymbolModel(this->enc,this->corr_bits + 1);
          this->mBits[uVar5] = pAVar3;
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->contexts);
        this_00 = this->enc;
      }
      ppAVar2 = (ArithmeticModel **)operator_new__((ulong)(this->corr_bits + 1) << 3);
      this->mCorrector = ppAVar2;
      pAVar3 = (ArithmeticModel *)ArithmeticEncoder::createBitModel(this_00);
      *this->mCorrector = pAVar3;
      if (this->corr_bits != 0) {
        uVar4 = 1;
        do {
          uVar1 = this->bits_high;
          if (uVar4 < this->bits_high) {
            uVar1 = uVar4;
          }
          pAVar3 = ArithmeticEncoder::createSymbolModel(this->enc,1 << ((byte)uVar1 & 0x1f));
          this->mCorrector[uVar4] = pAVar3;
          uVar4 = uVar4 + 1;
        } while (uVar4 <= this->corr_bits);
      }
    }
    if (this->contexts != 0) {
      uVar5 = 0;
      do {
        ArithmeticEncoder::initSymbolModel(this->enc,this->mBits[uVar5],(U32 *)0x0);
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->contexts);
    }
    ArithmeticEncoder::initBitModel(this->enc,(ArithmeticBitModel *)*this->mCorrector);
    if (this->corr_bits != 0) {
      uVar5 = 1;
      do {
        ArithmeticEncoder::initSymbolModel(this->enc,this->mCorrector[uVar5],(U32 *)0x0);
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 <= this->corr_bits);
    }
    return;
  }
  __assert_fail("enc",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                ,0xdf,"void IntegerCompressor::initCompressor()");
}

Assistant:

void IntegerCompressor::initCompressor()
{
  U32 i;

  assert(enc);

  // maybe create the models
  if (mBits == 0)
  {
    mBits = new ArithmeticModel*[contexts];
    for (i = 0; i < contexts; i++)
    {
      mBits[i] = enc->createSymbolModel(corr_bits+1);
    }
#ifndef COMPRESS_ONLY_K
    mCorrector = new ArithmeticModel*[corr_bits+1];
    mCorrector[0] = (ArithmeticModel*)enc->createBitModel();
    for (i = 1; i <= corr_bits; i++)
    {
      if (i <= bits_high)
      {
        mCorrector[i] = enc->createSymbolModel(1<<i);
      }
      else
      {
        mCorrector[i] = enc->createSymbolModel(1<<bits_high);
      }
    }
#endif
  }

  // certainly init the models
  for (i = 0; i < contexts; i++)
  {
    enc->initSymbolModel(mBits[i]);
  }
#ifndef COMPRESS_ONLY_K
  enc->initBitModel((ArithmeticBitModel*)mCorrector[0]);
  for (i = 1; i <= corr_bits; i++)
  {
    enc->initSymbolModel(mCorrector[i]);
  }
#endif
}